

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

void __thiscall Hospital::Hospital(Hospital *this)

{
  Hospital *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->Admin_Password);
  std::vector<Doctor,_std::allocator<Doctor>_>::vector(&this->All_Of_Doctors);
  std::vector<Nurse,_std::allocator<Nurse>_>::vector(&this->All_Of_Nurses);
  std::vector<Patient,_std::allocator<Patient>_>::vector(&this->All_Of_Patients);
  std::__cxx11::string::operator=((string *)this,"123");
  std::__cxx11::string::operator=((string *)&this->Admin_Password,"78");
  return;
}

Assistant:

Hospital :: Hospital() {
    Admin_Username = "123";
    Admin_Password = "78";
}